

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O1

void __thiscall
ON_SubDEdgeIterator::ON_SubDEdgeIterator
          (ON_SubDEdgeIterator *this,ON_SubD *subd,ON_SubDVertex *vertex)

{
  uint edge_count;
  ON_SubDEdge *first;
  ON_SubDEdge *last;
  ON_SubDComponentPtr component_ptr;
  ON_SubDRef OStack_38;
  
  ON_SubDRef::ON_SubDRef(&this->m_subd_ref);
  this->m_e_current = (ON_SubDEdge *)0x0;
  this->m_edge_index = 0;
  this->m_edge_count = 0;
  this->m_e_first = (ON_SubDEdge *)0x0;
  this->m_e_last = (ON_SubDEdge *)0x0;
  (this->m_component_ptr).m_ptr = 0;
  edge_count = ON_SubDVertex::EdgeCount(vertex);
  ON_SubDRef::CreateReferenceForExperts(&OStack_38,subd);
  first = ON_SubDVertex::Edge(vertex,0);
  last = ON_SubDVertex::Edge(vertex,edge_count - 1);
  component_ptr = ON_SubDComponentPtr::Create(vertex);
  Internal_Init(this,&OStack_38,edge_count,first,last,component_ptr);
  ON_SubDRef::~ON_SubDRef(&OStack_38);
  return;
}

Assistant:

ON_SubDEdgeIterator::ON_SubDEdgeIterator(
  const class ON_SubD& subd,
  const class ON_SubDVertex& vertex
  )
{
  const unsigned int edge_count = vertex.EdgeCount();
  Internal_Init(
    ON_SubDRef::CreateReferenceForExperts(subd),
    edge_count,
    vertex.Edge(0),
    vertex.Edge(edge_count - 1),
    ON_SubDComponentPtr::Create(&vertex)
  );
}